

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O0

void Of_ManSetDefaultPars(Jf_Par_t *pPars)

{
  Jf_Par_t *pPars_local;
  
  memset(pPars,0,0x108);
  pPars->nLutSize = 4;
  pPars->nCutNum = 0x10;
  pPars->nProcNum = 0;
  pPars->nRounds = 3;
  pPars->nRoundsEla = 4;
  pPars->nRelaxRatio = 0;
  pPars->nCoarseLimit = 3;
  pPars->nAreaTuner = 10;
  pPars->DelayTarget = -1;
  pPars->nDelayLut1 = 10;
  pPars->nDelayLut2 = 2;
  pPars->nFastEdges = 0;
  pPars->fAreaOnly = 0;
  pPars->fOptEdge = 1;
  pPars->fCoarsen = 0;
  pPars->fCutMin = 0;
  pPars->fGenCnf = 0;
  pPars->fPureAig = 0;
  pPars->fVerbose = 0;
  pPars->fVeryVerbose = 0;
  pPars->nLutSizeMax = 6;
  pPars->nCutNumMax = 0x20;
  pPars->MapDelayTarget = -1.0;
  return;
}

Assistant:

void Of_ManSetDefaultPars( Jf_Par_t * pPars )
{
    memset( pPars, 0, sizeof(Jf_Par_t) );
    pPars->nLutSize     =  4;
    pPars->nCutNum      = 16;
    pPars->nProcNum     =  0;
    pPars->nRounds      =  3;
    pPars->nRoundsEla   =  4;
    pPars->nRelaxRatio  =  0;
    pPars->nCoarseLimit =  3;
    pPars->nAreaTuner   = 10;
    pPars->DelayTarget  = -1;
    pPars->nDelayLut1   = 10;
    pPars->nDelayLut2   =  2;
    pPars->nFastEdges   =  0; //
    pPars->fAreaOnly    =  0;
    pPars->fOptEdge     =  1; 
    pPars->fCoarsen     =  0;
    pPars->fCutMin      =  0;
    pPars->fGenCnf      =  0;
    pPars->fPureAig     =  0;
    pPars->fVerbose     =  0;
    pPars->fVeryVerbose =  0;
    pPars->nLutSizeMax  =  OF_LEAF_MAX;
    pPars->nCutNumMax   =  OF_CUT_MAX;
    pPars->MapDelayTarget = -1;
}